

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::trySetValidIndex(QComboBoxPrivate *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  QAbstractItemModel *pQVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 8);
  plVar3 = *(long **)(lVar2 + 0x298);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            (&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
  iVar5 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = this->model;
      iVar1 = this->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,&this->root);
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar7,iVar1,&local_70);
      if ((local_58.m.ptr != (QAbstractItemModel *)0x0) &&
         (uVar6 = (**(code **)(*(long *)local_58.m.ptr + 0x138))(local_58.m.ptr,&local_58),
         (uVar6 & 0x20) != 0)) goto LAB_003d3241;
      iVar7 = iVar7 + 1;
    } while (iVar5 != iVar7);
  }
  local_58._0_8_ = (undefined1 *)0xffffffffffffffff;
  local_58.i = 0;
  local_58.m.ptr = (QAbstractItemModel *)0x0;
LAB_003d3241:
  setCurrentIndex(this,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::trySetValidIndex()
{
    Q_Q(QComboBox);
    bool currentReset = false;

    const int rowCount = q->count();
    for (int pos = 0; pos < rowCount; ++pos) {
        const QModelIndex idx(model->index(pos, modelColumn, root));
        if (idx.flags() & Qt::ItemIsEnabled) {
            setCurrentIndex(idx);
            currentReset = true;
            break;
        }
    }

    if (!currentReset)
        setCurrentIndex(QModelIndex());
}